

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

char * __thiscall cmCPackGenerator::GetPackagingInstallPrefix(cmCPackGenerator *this)

{
  cmCPackLog *this_00;
  ostream *poVar1;
  char *pcVar2;
  allocator local_1a9;
  string local_1a8;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCPackLog_msg,"GetPackagingInstallPrefix: \'");
  std::__cxx11::string::string((string *)&local_1a8,"CPACK_PACKAGING_INSTALL_PREFIX",&local_1a9);
  pcVar2 = GetOption(this,&local_1a8);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\'");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1a8);
  this_00 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(this_00,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x4fb,local_1a8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_PACKAGING_INSTALL_PREFIX",(allocator *)&local_1a8);
  pcVar2 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  return pcVar2;
}

Assistant:

const char* cmCPackGenerator::GetPackagingInstallPrefix()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "GetPackagingInstallPrefix: '"
    << this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX") << "'" << std::endl);

  return this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
}